

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::restart(Amr *this,string *filename)

{
  undefined8 *puVar1;
  double *pdVar2;
  ostringstream *poVar3;
  undefined1 uVar4;
  pointer pcVar5;
  pointer pGVar6;
  undefined8 uVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer puVar13;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar14;
  byte bVar15;
  undefined8 uVar16;
  char *__nptr;
  char cVar17;
  bool bVar18;
  int iVar19;
  ostream *poVar20;
  long *plVar21;
  mapped_type *charBuf;
  long lVar22;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var23;
  long *plVar24;
  size_type *psVar25;
  long lVar26;
  undefined1 *puVar27;
  string *unaff_RBP;
  long lVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  double dVar32;
  int mx_lev;
  string first_line;
  string File;
  string faHeaderFullName;
  int spdim;
  int int_dummy;
  __string_type __str_1;
  IO_Buffer io_buffer;
  string fileCharPtrString;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> inputs_domain;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  int linit;
  istringstream is;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  faHeaderMap;
  undefined4 in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  char *local_478;
  size_t local_470;
  char local_468;
  undefined7 uStack_467;
  string local_458;
  string local_438;
  uint *local_410;
  uint local_404;
  int local_400;
  int local_3fc;
  Box local_3f8;
  vector<char,_std::allocator<char>_> local_3d8;
  long *local_3c0 [2];
  long local_3b0 [2];
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_3a0;
  Vector<char,_std::allocator<char>_> local_388;
  double local_370;
  undefined1 local_368 [24];
  Real aRStack_350 [11];
  ios_base local_2f8 [280];
  double local_1e0 [4];
  byte abStack_1c0 [88];
  ios_base local_168 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  local_60;
  
  this->which_level_being_advanced = -1;
  local_370 = second();
  VisMF::SetMFFileInStreams((anonymous_namespace)::mffile_nstreams,ParallelDescriptor::m_comm);
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    poVar20 = OutStream();
    poVar3 = (ostringstream *)(local_368 + 0x10);
    local_368._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_368._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    local_368._8_4_ = SUB84(poVar20,0);
    local_368._12_4_ = (undefined4)((ulong)poVar20 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    *(undefined8 *)
     ((long)aRStack_350 + *(long *)(CONCAT44(local_368._20_4_,local_368._16_4_) + -0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(local_368._12_4_,local_368._8_4_) +
          *(long *)(*(long *)CONCAT44(local_368._12_4_,local_368._8_4_) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"restarting calculation from file: ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
    Print::~Print((Print *)local_368);
  }
  if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->runlog,"RESTART from file = ",0x14);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&this->runlog,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    local_368[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_368,1);
  }
  if ((this->probin_file)._M_string_length != 0) {
    local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
    readProbinFile(this,(int *)local_368);
  }
  if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->runlog,"RESTART from file = ",0x14);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&this->runlog,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    local_368[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_368,1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((anonymous_namespace)::prereadFAHeaders == '\x01') {
    pcVar5 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,pcVar5,pcVar5 + filename->_M_string_length);
    std::__cxx11::string::append((char *)&local_458);
    local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_368._0_4_ = ParallelDescriptor::m_comm;
    ParallelDescriptor::ReadAndBcastFile
              (&local_458,(Vector<char,_std::allocator<char>_> *)&local_3d8,false,
               (MPI_Comm *)local_368);
    if (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start &&
        -1 < (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
      std::__cxx11::string::string
                ((string *)local_3c0,
                 local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,(allocator *)local_368);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1e0,(string *)local_3c0,_S_in);
      if ((abStack_1c0[*(long *)((long)local_1e0[0] + -0x18)] & 2) == 0) {
        poVar3 = (ostringstream *)(local_368 + 0x10);
        unaff_RBP = (string *)&local_3f8;
        do {
          local_478 = &local_468;
          local_470 = 0;
          local_468 = '\0';
          std::operator>>((istream *)local_1e0,(string *)&local_478);
          if ((abStack_1c0[*(long *)((long)local_1e0[0] + -0x18)] & 2) == 0) {
            local_3f8.smallend.vect._0_8_ = (long)&local_3f8 + 0x10;
            pcVar5 = (filename->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      (unaff_RBP,pcVar5,pcVar5 + filename->_M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)unaff_RBP,
                       CONCAT44(local_3f8.bigend.vect[0],local_3f8.smallend.vect[2]),0,'\x01');
            plVar21 = (long *)std::__cxx11::string::_M_append((char *)unaff_RBP,(ulong)local_478);
            local_368._0_8_ = local_368 + 0x10;
            plVar24 = plVar21 + 2;
            if ((long *)*plVar21 == plVar24) {
              aRStack_350[0] = (Real)plVar21[3];
              local_368._16_4_ = (undefined4)*plVar24;
              local_368._20_4_ = (undefined4)((ulong)*plVar24 >> 0x20);
            }
            else {
              local_368._16_4_ = (undefined4)*plVar24;
              local_368._20_4_ = (undefined4)((ulong)*plVar24 >> 0x20);
              local_368._0_8_ = (long *)*plVar21;
            }
            local_368._8_4_ = (undefined4)plVar21[1];
            local_368._12_4_ = (undefined4)((ulong)plVar21[1] >> 0x20);
            *plVar21 = (long)plVar24;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            plVar21 = (long *)std::__cxx11::string::append(local_368);
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            psVar25 = (size_type *)(plVar21 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar21 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar25) {
              local_438.field_2._M_allocated_capacity = *psVar25;
              local_438.field_2._8_8_ = plVar21[3];
            }
            else {
              local_438.field_2._M_allocated_capacity = *psVar25;
              local_438._M_dataplus._M_p = (pointer)*plVar21;
            }
            local_438._M_string_length = plVar21[1];
            *plVar21 = (long)psVar25;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
              operator_delete((void *)local_368._0_8_,
                              CONCAT44(local_368._20_4_,local_368._16_4_) + 1);
            }
            if ((void *)local_3f8.smallend.vect._0_8_ != (void *)((long)&local_3f8 + 0x10U)) {
              operator_delete((void *)local_3f8.smallend.vect._0_8_,
                              CONCAT44(local_3f8.bigend.vect[2],local_3f8.bigend.vect[1]) + 1);
            }
            charBuf = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                                    *)&local_60,&local_438);
            local_368._0_4_ = ParallelDescriptor::m_comm;
            ParallelDescriptor::ReadAndBcastFile(&local_438,charBuf,true,(MPI_Comm *)local_368);
            if (2 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
              poVar20 = OutStream();
              local_368._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
              local_368._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
              local_368._8_4_ = SUB84(poVar20,0);
              local_368._12_4_ = (undefined4)((ulong)poVar20 >> 0x20);
              std::__cxx11::ostringstream::ostringstream(poVar3);
              *(undefined8 *)
               ((long)aRStack_350 + *(long *)(CONCAT44(local_368._20_4_,local_368._16_4_) + -0x18))
                   = *(undefined8 *)
                      ((long)CONCAT44(local_368._12_4_,local_368._8_4_) +
                      *(long *)(*(long *)CONCAT44(local_368._12_4_,local_368._8_4_) + -0x18) + 8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,
                         ":::: faHeaderName faHeaderFullName tempCharArray.size() = ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,local_478,local_470);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"  ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,local_438._M_dataplus._M_p,local_438._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"  ",2);
              std::ostream::_M_insert<long>((long)poVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              Print::~Print((Print *)local_368);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_478 != &local_468) {
            operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
          }
        } while ((abStack_1c0[*(long *)((long)local_1e0[0] + -0x18)] & 2) == 0);
      }
      StateData::faHeaderMap_abi_cxx11_ = &local_60;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1e0);
      std::ios_base::~ios_base(local_168);
      if (local_3c0[0] != local_3b0) {
        operator_delete(local_3c0[0],local_3b0[0] + 1);
      }
    }
    if (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
  }
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  pcVar5 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_458,pcVar5,pcVar5 + filename->_M_string_length);
  std::__cxx11::string::append((char *)&local_458);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_3d8,VisMFBuffer::ioBufferSize,(allocator_type *)local_368);
  local_388.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (char *)0x0;
  local_388.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_388.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_368._0_4_ = ParallelDescriptor::m_comm;
  ParallelDescriptor::ReadAndBcastFile(&local_458,&local_388,true,(MPI_Comm *)local_368);
  std::__cxx11::string::string
            ((string *)local_3c0,
             local_388.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)local_368);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1e0,(string *)local_3c0,_S_in);
  local_478 = &local_468;
  local_470 = 0;
  local_468 = '\0';
  cVar17 = std::ios::widen((char)(istringstream *)local_1e0 +
                           (char)*(undefined8 *)((long)local_1e0[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1e0,(string *)&local_478,cVar17);
  __nptr = local_478;
  if ((local_470 == DAT_008177f0) &&
     ((local_470 == 0 ||
      (iVar19 = bcmp(local_478,(anonymous_namespace)::CheckPointVersion_abi_cxx11_,local_470),
      iVar19 == 0)))) {
    std::istream::operator>>((istream *)local_1e0,&local_400);
    uVar31 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  else {
    local_400 = atoi(__nptr);
    uVar31 = 0;
  }
  if (local_400 != 3) {
    poVar20 = ErrorStream();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar20,"Amr::restart(): bad spacedim = ",0x1f);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_400);
    local_368[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_368,1);
    Abort_host((char *)0x0);
  }
  std::istream::_M_extract<double>(local_1e0);
  std::istream::operator>>((istream *)local_1e0,(int *)&stack0xfffffffffffffb84);
  local_410 = (uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  std::istream::operator>>((istream *)local_1e0,(int *)local_410);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            (&local_3a0,(long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
             (allocator_type *)local_368);
  iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (-1 < iVar19) {
    lVar22 = -1;
    lVar26 = 0xb8;
    lVar28 = 0;
    do {
      pGVar6 = (this->super_AmrCore).super_AmrMesh.geom.
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_368._8_4_ =
           *(undefined4 *)((long)(pGVar6->super_CoordSys).offset + lVar26 + 0xfffffffffffffff4U);
      local_368._0_8_ =
           *(undefined8 *)((long)(pGVar6->super_CoordSys).offset + lVar26 + 0xffffffffffffffecU);
      local_368._20_4_ = *(undefined4 *)((long)(pGVar6->super_CoordSys).offset + lVar26);
      uVar7 = *(undefined8 *)((long)(pGVar6->super_CoordSys).offset + lVar26 + 0xfffffffffffffff8U);
      local_368._12_4_ = (undefined4)uVar7;
      local_368._16_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      puVar1 = (undefined8 *)
               ((long)((local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                        _M_impl.super__Vector_impl_data._M_start)->smallend).vect + lVar28);
      *puVar1 = local_368._0_8_;
      puVar1[1] = CONCAT44(local_368._12_4_,local_368._8_4_);
      *(ulong *)((long)((local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_start)->bigend).vect + lVar28 + 4) =
           CONCAT44(local_368._20_4_,local_368._16_4_);
      *(undefined4 *)
       ((long)&((IndexType *)
               (&(local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start)->bigend + 1))->itype + lVar28) = 0;
      iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar22 = lVar22 + 1;
      lVar28 = lVar28 + 0x1c;
      lVar26 = lVar26 + 200;
    } while (lVar22 < iVar19);
  }
  if ((int)in_stack_fffffffffffffb84 <= iVar19) {
    if (-1 < (int)in_stack_fffffffffffffb84) {
      lVar26 = -1;
      lVar22 = 0;
      do {
        amrex::operator>>((istream *)local_1e0,
                          (Geometry *)
                          ((long)(((this->super_AmrCore).super_AmrMesh.geom.
                                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                 offset + lVar22 + 0xfffffffffffffff8U));
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 200;
      } while (lVar26 < (int)in_stack_fffffffffffffb84);
      if (0 < (int)in_stack_fffffffffffffb84) {
        lVar26 = 0;
        lVar22 = 0;
        do {
          amrex::operator>>((istream *)local_1e0,
                            (IntVect *)
                            ((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect + lVar26));
          lVar22 = lVar22 + 1;
          lVar26 = lVar26 + 0xc;
        } while (lVar22 < (int)in_stack_fffffffffffffb84);
      }
      if (-1 < (int)in_stack_fffffffffffffb84) {
        lVar22 = -1;
        do {
          std::istream::_M_extract<double>(local_1e0);
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)in_stack_fffffffffffffb84);
      }
    }
    if ((char)uVar31 == '\0') {
      if (-1 < (int)in_stack_fffffffffffffb84) {
        pdVar11 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar12 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar31 = 0;
        do {
          pdVar12[uVar31] = pdVar11[uVar31];
          uVar31 = uVar31 + 1;
        } while (in_stack_fffffffffffffb84 + 1 != uVar31);
      }
    }
    else if (-1 < (int)in_stack_fffffffffffffb84) {
      lVar22 = -1;
      do {
        std::istream::_M_extract<double>(local_1e0);
        lVar22 = lVar22 + 1;
      } while (lVar22 < (int)in_stack_fffffffffffffb84);
    }
    local_438._M_dataplus._M_p = (pointer)0x0;
    local_438._M_string_length = 0;
    local_438.field_2._M_allocated_capacity = 0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_438,
               (long)(int)(in_stack_fffffffffffffb84 + 1));
    if (-1 < (int)in_stack_fffffffffffffb84) {
      lVar26 = -1;
      lVar22 = 0;
      do {
        std::istream::operator>>((istream *)local_1e0,(int *)(local_438._M_dataplus._M_p + lVar22));
        uVar31 = (ulong)(int)in_stack_fffffffffffffb84;
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 4;
      } while (lVar26 < (long)uVar31);
      if (-1 < (int)in_stack_fffffffffffffb84) {
        poVar3 = (ostringstream *)(local_368 + 0x10);
        bVar15 = 0;
        lVar22 = 0;
        do {
          if (((this->n_cycle).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar22] != *(int *)(local_438._M_dataplus._M_p + lVar22 * 4)) &&
             (bVar15 = 1, 0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose)) {
            poVar20 = OutStream();
            local_368._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
            local_368._0_4_ = *(int *)(DAT_00816950 + -0x30);
            local_368._8_4_ = SUB84(poVar20,0);
            local_368._12_4_ = (undefined4)((ulong)poVar20 >> 0x20);
            std::__cxx11::ostringstream::ostringstream(poVar3);
            *(undefined8 *)
             ((long)aRStack_350 + *(long *)(CONCAT44(local_368._20_4_,local_368._16_4_) + -0x18)) =
                 *(undefined8 *)
                  ((long)CONCAT44(local_368._12_4_,local_368._8_4_) +
                  *(long *)(*(long *)CONCAT44(local_368._12_4_,local_368._8_4_) + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"Warning: n_cycle has changed at level ",0x26);
            std::ostream::operator<<(poVar3,(int)lVar22);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," from ",6);
            std::ostream::operator<<(poVar3,*(int *)(local_438._M_dataplus._M_p + lVar22 * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," to ",4);
            std::ostream::operator<<
                      (poVar3,(this->n_cycle).super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar22]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
            Print::~Print((Print *)local_368);
            uVar31 = (ulong)in_stack_fffffffffffffb84;
          }
          bVar18 = lVar22 < (int)uVar31;
          lVar22 = lVar22 + 1;
        } while (bVar18);
        if (((bool)(0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level & bVar15)) &&
           (*(this->level_count).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
                 = *(this->regrid_int).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start, 0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose)) {
          poVar20 = OutStream();
          local_368._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
          local_368._0_4_ = *(int *)(DAT_00816950 + -0x30);
          local_368._8_4_ = SUB84(poVar20,0);
          local_368._12_4_ = (undefined4)((ulong)poVar20 >> 0x20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_368 + 0x10));
          *(undefined8 *)
           ((long)aRStack_350 + *(long *)(CONCAT44(local_368._20_4_,local_368._16_4_) + -0x18)) =
               *(undefined8 *)
                ((long)CONCAT44(local_368._12_4_,local_368._8_4_) +
                *(long *)(*(long *)CONCAT44(local_368._12_4_,local_368._8_4_) + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_368 + 0x10),"Warning: This forces a full regrid \n",0x24);
          Print::~Print((Print *)local_368);
        }
      }
      if (-1 < (int)in_stack_fffffffffffffb84) {
        lVar26 = -1;
        lVar22 = 0;
        do {
          std::istream::operator>>
                    ((istream *)local_1e0,
                     (int *)((long)(this->level_steps).super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar22));
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 4;
        } while (lVar26 < (int)in_stack_fffffffffffffb84);
        if (-1 < (int)in_stack_fffffffffffffb84) {
          lVar26 = -1;
          lVar22 = 0;
          do {
            std::istream::operator>>
                      ((istream *)local_1e0,
                       (int *)((long)(this->level_count).super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar22));
            lVar26 = lVar26 + 1;
            lVar22 = lVar22 + 4;
          } while (lVar26 < (int)in_stack_fffffffffffffb84);
        }
      }
    }
    iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    if ((int)in_stack_fffffffffffffb84 < iVar19) {
      pdVar11 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar8 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar9 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar10 = (this->level_count).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar22 = (long)(int)in_stack_fffffffffffffb84;
      dVar32 = pdVar11[lVar22];
      do {
        iVar19 = piVar9[lVar22 + 1];
        dVar32 = dVar32 / (double)iVar19;
        pdVar11[lVar22 + 1] = dVar32;
        piVar8[lVar22 + 1] = iVar19 * piVar8[lVar22];
        piVar10[lVar22 + 1] = 0;
        lVar22 = lVar22 + 1;
        iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      } while (lVar22 < iVar19);
      uVar30 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      if (0 < (int)uVar30 && this->sub_cycle == 0) {
        lVar22 = 0;
        do {
          pdVar11 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar32 = pdVar11[lVar22 + 1];
          pdVar2 = pdVar11 + lVar22;
          if ((dVar32 != *pdVar2) || (NAN(dVar32) || NAN(*pdVar2))) {
            Error_host("restart: must have same dt at all levels if not subcycling");
            uVar30 = *local_410;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)uVar30);
        iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      }
    }
    if (((anonymous_namespace)::regrid_on_restart != 0) && (0 < iVar19)) {
      iVar19 = *(this->regrid_int).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (iVar19 < 1) {
        Error_host("restart: can\'t have regrid_on_restart and regrid_int <= 0");
      }
      else {
        *(this->level_count).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             iVar19;
      }
    }
    checkInput(this);
    if (-1 < (int)*local_410) {
      lVar22 = 0;
      do {
        puVar13 = (this->amr_level).
                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
             (**(code **)(*(long *)this->levelbld + 0x28))();
        tVar14.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
              &puVar13[lVar22]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        puVar13[lVar22]._M_t.
        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
             _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
        if (tVar14.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
          (**(code **)(*(long *)tVar14.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))
                    ();
        }
        _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var23.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x58))
                  (_Var23.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,this,local_1e0,0);
        AmrMesh::SetBoxArray
                  ((AmrMesh *)this,(int)lVar22,
                   (BoxArray *)
                   ((long)(this->amr_level).
                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                   + 0xd8));
        AmrMesh::SetDistributionMap
                  ((AmrMesh *)this,(int)lVar22,
                   (DistributionMapping *)
                   ((long)(this->amr_level).
                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                   + 0x140));
        iVar19 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        bVar18 = lVar22 < iVar19;
        lVar22 = lVar22 + 1;
      } while (bVar18);
      if (-1 < iVar19) {
        lVar22 = -1;
        do {
          (**(code **)(*(long *)(this->amr_level).
                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar22 + 1]._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0x90))();
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)*local_410);
      }
    }
    if (local_438._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_438._M_dataplus._M_p,
                      local_438.field_2._M_allocated_capacity - (long)local_438._M_dataplus._M_p);
    }
    goto LAB_005ae522;
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    Warning_host((char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  iVar29 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  if (iVar29 < iVar19) {
    iVar19 = iVar29;
  }
  *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = iVar19;
  Geometry::Geometry((Geometry *)local_368);
  local_438._M_dataplus._M_p = (pointer)0x0;
  local_438._M_string_length = local_438._M_string_length & 0xffffffff00000000;
  iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  local_404 = (uint)uVar31;
  if (-1 < iVar29) {
    lVar26 = -1;
    lVar22 = 0;
    do {
      amrex::operator>>((istream *)local_1e0,
                        (Geometry *)
                        ((long)(((this->super_AmrCore).super_AmrMesh.geom.
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                        + lVar22 + 0xfffffffffffffff8U));
      iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar26 = lVar26 + 1;
      lVar22 = lVar22 + 200;
    } while (lVar26 < iVar29);
    uVar31 = (ulong)local_404;
  }
  cVar17 = (char)uVar31;
  iVar29 = iVar29 + -1;
  while (iVar29 = iVar29 + 1, iVar29 < (int)in_stack_fffffffffffffb84) {
    amrex::operator>>((istream *)local_1e0,(Geometry *)local_368);
  }
  uVar30 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  uVar31 = (ulong)uVar30;
  if (0 < (int)uVar30) {
    lVar26 = 0;
    lVar22 = 0;
    do {
      amrex::operator>>((istream *)local_1e0,
                        (IntVect *)
                        ((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start)->vect + lVar26));
      lVar22 = lVar22 + 1;
      uVar31 = (ulong)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar26 = lVar26 + 0xc;
    } while (lVar22 < (long)uVar31);
    cVar17 = (char)local_404;
  }
  iVar29 = (int)uVar31;
  if (iVar29 < (int)in_stack_fffffffffffffb84) {
    do {
      amrex::operator>>((istream *)local_1e0,(IntVect *)&local_438);
      uVar30 = (int)uVar31 + 1;
      uVar31 = (ulong)uVar30;
    } while ((int)uVar30 < (int)in_stack_fffffffffffffb84);
    iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  if (-1 < iVar29) {
    lVar22 = -1;
    do {
      std::istream::_M_extract<double>(local_1e0);
      iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar29);
    cVar17 = (char)local_404;
  }
  iVar29 = iVar29 + -1;
  while (iVar29 = iVar29 + 1, iVar29 < (int)in_stack_fffffffffffffb84) {
    std::istream::_M_extract<double>(local_1e0);
  }
  uVar30 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (cVar17 == '\0') {
    if (-1 < (int)uVar30) {
      pdVar11 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar12 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar22 = 0;
      do {
        pdVar12[lVar22] = pdVar11[lVar22];
        lVar22 = lVar22 + 1;
      } while ((ulong)uVar30 + 1 != lVar22);
      goto LAB_005ae1d2;
    }
  }
  else {
    if (-1 < (int)uVar30) {
      lVar22 = -1;
      do {
        std::istream::_M_extract<double>(local_1e0);
        uVar30 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar22 = lVar22 + 1;
      } while (lVar22 < (int)uVar30);
    }
    iVar29 = uVar30 - 1;
    while (iVar29 = iVar29 + 1, iVar29 < (int)in_stack_fffffffffffffb84) {
      std::istream::_M_extract<double>(local_1e0);
    }
    uVar30 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
LAB_005ae1d2:
    if (-1 < (int)uVar30) {
      lVar26 = -1;
      lVar22 = 0;
      do {
        std::istream::operator>>
                  ((istream *)local_1e0,
                   (int *)((long)(this->n_cycle).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar22));
        uVar30 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 4;
      } while (lVar26 < (int)uVar30);
    }
  }
  iVar29 = uVar30 - 1;
  while (iVar29 = iVar29 + 1, iVar29 < (int)in_stack_fffffffffffffb84) {
    std::istream::operator>>((istream *)local_1e0,&local_3fc);
  }
  iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (-1 < iVar29) {
    lVar26 = -1;
    lVar22 = 0;
    do {
      std::istream::operator>>
                ((istream *)local_1e0,
                 (int *)((long)(this->level_steps).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar22));
      iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar26 = lVar26 + 1;
      lVar22 = lVar22 + 4;
    } while (lVar26 < iVar29);
  }
  iVar29 = iVar29 + -1;
  while (iVar29 = iVar29 + 1, iVar29 < (int)in_stack_fffffffffffffb84) {
    std::istream::operator>>((istream *)local_1e0,&local_3fc);
  }
  iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (-1 < iVar29) {
    lVar26 = -1;
    lVar22 = 0;
    do {
      std::istream::operator>>
                ((istream *)local_1e0,
                 (int *)((long)(this->level_count).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar22));
      iVar29 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar26 = lVar26 + 1;
      lVar22 = lVar22 + 4;
    } while (lVar26 < iVar29);
  }
  iVar29 = iVar29 + -1;
  while (iVar29 = iVar29 + 1, iVar29 < (int)in_stack_fffffffffffffb84) {
    std::istream::operator>>((istream *)local_1e0,&local_3fc);
  }
  if (((anonymous_namespace)::regrid_on_restart != 0) &&
     (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level)) {
    iVar29 = *(this->regrid_int).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    if (iVar29 < 1) {
      Error_host("restart: can\'t have regrid_on_restart and regrid_int <= 0");
    }
    else {
      *(this->level_count).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           iVar29;
    }
  }
  checkInput(this);
  if (-1 < iVar19) {
    uVar31 = 0;
    do {
      puVar13 = (this->amr_level).
                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
           (**(code **)(*(long *)this->levelbld + 0x28))();
      tVar14.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
            &puVar13[uVar31]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      puVar13[uVar31]._M_t.
      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
           _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
           .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
           super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
      if (tVar14.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
        (**(code **)(*(long *)tVar14.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
      }
      _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      (**(code **)(*(long *)_Var23.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x58))
                (_Var23.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,this,local_1e0,0);
      AmrMesh::SetBoxArray
                ((AmrMesh *)this,(int)uVar31,
                 (BoxArray *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0xd8));
      AmrMesh::SetDistributionMap
                ((AmrMesh *)this,(int)uVar31,
                 (DistributionMapping *)
                 ((long)(this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 + 0x140));
      uVar31 = uVar31 + 1;
    } while (iVar19 + 1 != uVar31);
    if (-1 < iVar19) {
      uVar31 = 0;
      do {
        (**(code **)(*(long *)(this->amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar31]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                    + 0x90))();
        uVar31 = uVar31 + 1;
      } while (iVar19 + 1 != uVar31);
    }
  }
LAB_005ae522:
  uVar30 = *local_410;
  if ((int)uVar30 < 0) {
    iVar19 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    this->last_checkpoint = iVar19;
    this->last_plotfile = iVar19;
  }
  else {
    puVar13 = (this->amr_level).
              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar27 = &(((this->super_AmrCore).super_AmrMesh.geom.
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_CoordSys).field_0x53;
    lVar22 = 0;
    do {
      _Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           puVar13[lVar22]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      uVar4 = *puVar27;
      *(undefined2 *)
       ((long)_Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
              _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
              super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x61) =
           *(undefined2 *)(puVar27 + -2);
      *(undefined1 *)
       ((long)_Var23.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
              _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
              super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 99) = uVar4;
      lVar22 = lVar22 + 1;
      puVar27 = puVar27 + 200;
    } while ((ulong)uVar30 + 1 != lVar22);
    iVar19 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    iVar29 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    this->last_checkpoint = iVar29;
    this->last_plotfile = iVar29;
    if (-1 < iVar19) {
      lVar28 = -1;
      lVar26 = 0xac;
      lVar22 = 0;
      do {
        pGVar6 = (this->super_AmrCore).super_AmrMesh.geom.
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)
                 ((long)(pGVar6->super_CoordSys).offset + lVar26 + 0xfffffffffffffff8U);
        local_3f8.smallend.vect._0_8_ = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pGVar6->super_CoordSys).offset + lVar26 + 4U);
        uVar16 = puVar1[1];
        local_3f8.bigend.vect[1] = (int)((ulong)*puVar1 >> 0x20);
        local_3f8.bigend.vect[2] = (int)uVar16;
        local_3f8.btype.itype = (uint)((ulong)uVar16 >> 0x20);
        local_3f8.smallend.vect[2] = (int)uVar7;
        local_3f8.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
        bVar18 = Box::operator==((Box *)((long)((local_3a0.
                                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               smallend).vect + lVar22),&local_3f8);
        if (!bVar18) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_368,"Problem at level ",0x11);
          poVar20 = (ostream *)std::ostream::operator<<(local_368,(int)lVar28 + 1);
          local_438._M_dataplus._M_p._0_1_ = 10;
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&local_438,1)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,"Domain according to     inputs file is ",0x27);
          poVar20 = amrex::operator<<(poVar20,(Box *)((long)((local_3a0.
                                                                                                                            
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  smallend).vect + lVar22));
          local_438._M_dataplus._M_p._0_1_ = 10;
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&local_438,1)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,"Domain according to checkpoint file is ",0x27);
          poVar20 = amrex::operator<<(poVar20,&local_3f8);
          local_438._M_dataplus._M_p._0_1_ = 10;
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&local_438,1)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,"Amr::restart() failed -- box from inputs file does not ",0x37);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,"equal box from restart file. \n",0x1e);
          std::__cxx11::stringbuf::str();
          Abort(&local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
          std::ios_base::~ios_base(local_2f8);
        }
        lVar28 = lVar28 + 1;
        lVar22 = lVar22 + 0x1c;
        lVar26 = lVar26 + 200;
      } while (lVar28 < (int)*local_410);
    }
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_410 = (uint *)second();
    poVar20 = OutStream();
    poVar3 = (ostringstream *)(local_368 + 0x10);
    local_368._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    local_368._0_4_ = *(int *)(DAT_00816950 + -0x30);
    local_368._8_4_ = SUB84(poVar20,0);
    local_368._12_4_ = (undefined4)((ulong)poVar20 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    *(undefined8 *)
     ((long)aRStack_350 + *(long *)(CONCAT44(local_368._20_4_,local_368._16_4_) + -0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(local_368._12_4_,local_368._8_4_) +
          *(long *)(*(long *)CONCAT44(local_368._12_4_,local_368._8_4_) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Restart time = ",0xf);
    std::ostream::_M_insert<double>((double)local_410 - local_370);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," seconds.",9);
    local_438._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,(char *)&local_438,1);
    Print::~Print((Print *)local_368);
  }
  if (local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a0.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1e0);
  std::ios_base::~ios_base(local_168);
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  if (local_388.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (char *)0x0) {
    operator_delete(local_388.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_388.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_388.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
Amr::restart (const std::string& filename)
{
    BL_PROFILE_REGION_START("Amr::restart()");
    BL_PROFILE("Amr::restart()");

    which_level_being_advanced = -1;

    auto dRestartTime0 = amrex::second();

    VisMF::SetMFFileInStreams(mffile_nstreams);

    if (verbose > 0) {
        amrex::Print() << "restarting calculation from file: " << filename << "\n";
    }

    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "RESTART from file = " << filename << '\n';
    }
    //
    // Init problem dependent data.
    //

#ifndef AMREX_NO_PROBINIT
    if (!probin_file.empty()) {
        int linit = false;
        readProbinFile(linit);
    }
#endif

    //
    // Start calculation from given restart file.
    //
    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "RESTART from file = " << filename << '\n';
    }

    // ---- preread and broadcast all FabArray headers if this file exists
    std::map<std::string, Vector<char> > faHeaderMap;
    if(prereadFAHeaders) {
      // ---- broadcast the file with the names of the fabarray headers
      std::string faHeaderFilesName(filename + "/FabArrayHeaders.txt");
      Vector<char> faHeaderFileChars;
      bool bExitOnError(false);  // ---- dont exit if this file does not exist
      ParallelDescriptor::ReadAndBcastFile(faHeaderFilesName, faHeaderFileChars,
                                           bExitOnError);
      if(faHeaderFileChars.size() > 0) {  // ---- headers were read
        std::string faFileCharPtrString(faHeaderFileChars.dataPtr());
        std::istringstream fais(faFileCharPtrString, std::istringstream::in);
        while ( ! fais.eof()) {  // ---- read and broadcast each header
          std::string faHeaderName;
          fais >> faHeaderName;
          if( ! fais.eof()) {
              std::string faHeaderFullName(filename + '/' + faHeaderName + "_H");
              Vector<char> &tempCharArray = faHeaderMap[faHeaderFullName];
              ParallelDescriptor::ReadAndBcastFile(faHeaderFullName, tempCharArray);
              if(verbose > 2) {
                  amrex::Print()
                      << ":::: faHeaderName faHeaderFullName tempCharArray.size() = " << faHeaderName
                      << "  " << faHeaderFullName << "  " << tempCharArray.size() << "\n";
              }
          }
        }
        StateData::SetFAHeaderMapPtr(&faHeaderMap);
      }
    }

    //
    // Open the checkpoint header file for reading.
    //
    std::string File(filename + "/Header");

    VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

    Vector<char> fileCharPtr;
    ParallelDescriptor::ReadAndBcastFile(File, fileCharPtr);
    std::string fileCharPtrString(fileCharPtr.dataPtr());
    std::istringstream is(fileCharPtrString, std::istringstream::in);
    //
    // Read global data.
    //
    // Attempt to differentiate between old and new CheckPointFiles.
    //
    int         spdim;
    bool        new_checkpoint_format = false;
    std::string first_line;

    std::getline(is,first_line);

    if (first_line == CheckPointVersion)
    {
        new_checkpoint_format = true;
        is >> spdim;
    }
    else
    {
        spdim = atoi(first_line.c_str());
    }

    if (spdim != AMREX_SPACEDIM)
    {
        amrex::ErrorStream() << "Amr::restart(): bad spacedim = " << spdim << '\n';
        amrex::Abort();
    }

    is >> cumtime;
    int mx_lev;
    is >> mx_lev;
    is >> finest_level;

    Vector<Box> inputs_domain(max_level+1);
    for (int lev = 0; lev <= max_level; ++lev)
    {
        Box bx(Geom(lev).Domain().smallEnd(),Geom(lev).Domain().bigEnd());
        inputs_domain[lev] = bx;
    }

    if (max_level >= mx_lev) {

       for (int i(0); i <= mx_lev; ++i) { is >> Geom(i);      }
       for (int i(0); i <  mx_lev; ++i) { is >> ref_ratio[i]; }
       for (int i(0); i <= mx_lev; ++i) { is >> dt_level[i];  }

       if (new_checkpoint_format)
       {
           for (int i(0); i <= mx_lev; ++i) { is >> dt_min[i]; }
       }
       else
       {
           for (int i(0); i <= mx_lev; ++i) { dt_min[i] = dt_level[i]; }
       }

       Vector<int>  n_cycle_in;
       n_cycle_in.resize(mx_lev+1);
       for (int i(0); i <= mx_lev; ++i) { is >> n_cycle_in[i]; }
       bool any_changed = false;

       for (int i(0); i <= mx_lev; ++i) {
           if (n_cycle[i] != n_cycle_in[i]) {
               any_changed = true;
               if (verbose > 0) {
                   amrex::Print() << "Warning: n_cycle has changed at level " << i <<
                       " from " << n_cycle_in[i] << " to " << n_cycle[i] << "\n";
               }
           }
       }

       // If we change n_cycle then force a full regrid from level 0 up
       if (max_level > 0 && any_changed)
       {
           level_count[0] = regrid_int[0];
           if (verbose > 0) {
               amrex::Print() << "Warning: This forces a full regrid \n";
           }
       }


       for (int i(0); i <= mx_lev; ++i) { is >> level_steps[i]; }
       for (int i(0); i <= mx_lev; ++i) { is >> level_count[i]; }

       //
       // Set bndry conditions.
       //
       if (max_level > mx_lev)
       {
           for (int i(mx_lev + 1); i <= max_level; ++i)
           {
               dt_level[i]    = dt_level[i-1]/n_cycle[i];
               level_steps[i] = n_cycle[i]*level_steps[i-1];
               level_count[i] = 0;
           }

           // This is just an error check
           if ( ! sub_cycle)
           {
               for (int i(1); i <= finest_level; ++i)
               {
                   if (dt_level[i] != dt_level[i-1]) {
                       amrex::Error("restart: must have same dt at all levels if not subcycling");
                   }
               }
           }
       }

       if (regrid_on_restart && max_level > 0)
       {
           if (regrid_int[0] > 0) {
               level_count[0] = regrid_int[0];
           } else {
               amrex::Error("restart: can't have regrid_on_restart and regrid_int <= 0");
           }
       }

       checkInput();
       //
       // Read levels.
       //
       for (int lev(0); lev <= finest_level; ++lev)
       {
           amr_level[lev].reset((*levelbld)());
           amr_level[lev]->restart(*this, is);
           this->SetBoxArray(lev, amr_level[lev]->boxArray());
           this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
       }
       //
       // Build any additional data structures.
       //
       for (int lev = 0; lev <= finest_level; lev++) {
           amr_level[lev]->post_restart();
       }

    } else {

       if (ParallelDescriptor::IOProcessor()) {
          amrex::Warning("Amr::restart(): max_level is lower than before");
       }

       int new_finest_level = std::min(max_level,finest_level);

       finest_level = new_finest_level;

       // These are just used to hold the extra stuff we have to read in.
       Geometry   geom_dummy;
       Real       real_dummy;
       int         int_dummy;
       IntVect intvect_dummy;

       for (int i(0)            ; i <= max_level; ++i) { is >> Geom(i); }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> geom_dummy; }

       for (int i(0)        ; i <  max_level; ++i) { is >> ref_ratio[i]; }
       for (int i(max_level); i <  mx_lev   ; ++i) { is >> intvect_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> dt_level[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> real_dummy; }

       if (new_checkpoint_format) {
           for (int i(0)            ; i <= max_level; ++i) { is >> dt_min[i]; }
           for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> real_dummy; }
       } else {
           for (int i(0); i <= max_level; ++i) { dt_min[i] = dt_level[i]; }
       }

       for (int i(0)            ; i <= max_level; ++i) { is >> n_cycle[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> level_steps[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       for (int i(0)            ; i <= max_level; ++i) { is >> level_count[i]; }
       for (int i(max_level + 1); i <= mx_lev   ; ++i) { is >> int_dummy; }

       if (regrid_on_restart && max_level > 0) {
           if (regrid_int[0] > 0)  {
               level_count[0] = regrid_int[0];
           } else {
               amrex::Error("restart: can't have regrid_on_restart and regrid_int <= 0");
           }
       }

       checkInput();

       //
       // Read levels.
       //
       for (int lev = 0; lev <= new_finest_level; lev++)
       {
           amr_level[lev].reset((*levelbld)());
           amr_level[lev]->restart(*this, is);
           this->SetBoxArray(lev, amr_level[lev]->boxArray());
           this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
       }
       //
       // Build any additional data structures.
       //
       for (int lev = 0; lev <= new_finest_level; lev++) {
           amr_level[lev]->post_restart();
       }
    }

    // Old checkpoints do not store isPeriodic.
    // So we have to set it after restart.
    for (int lev = 0; lev <= finest_level; ++lev)
    {
        amr_level[lev]->geom.setPeriodicity(Geom(lev).isPeriodic());
    }

    // Save the number of steps taken so far. This mainly
    // helps in the edge case where we end up not taking
    // any timesteps before the run terminates, so that
    // we know not to unnecessarily overwrite the old file.
    last_checkpoint = level_steps[0];
    last_plotfile = level_steps[0];

    for (int lev = 0; lev <= finest_level; ++lev)
    {
        Box restart_domain(Geom(lev).Domain());
        if ( ! (inputs_domain[lev] == restart_domain) )
        {
            std::ostringstream ss;
            ss  << "Problem at level " << lev << '\n'
                << "Domain according to     inputs file is " <<  inputs_domain[lev] << '\n'
                << "Domain according to checkpoint file is " << restart_domain      << '\n'
                << "Amr::restart() failed -- box from inputs file does not "
                << "equal box from restart file. \n";
            amrex::Abort(ss.str());
        }
    }

    if (verbose > 0)
    {
        auto dRestartTime = amrex::second() - dRestartTime0;

        ParallelDescriptor::ReduceRealMax(dRestartTime,ParallelDescriptor::IOProcessorNumber());

        amrex::Print() << "Restart time = " << dRestartTime << " seconds." << '\n';
    }
    BL_PROFILE_REGION_STOP("Amr::restart()");
}